

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O2

expression_base_value_f effect_value_base_by_name(char *name)

{
  value_base_s *pvVar1;
  wchar_t wVar2;
  value_base_s *pvVar3;
  
  pvVar1 = effect_value_base_by_name::value_bases;
  do {
    pvVar3 = pvVar1;
    if (pvVar3->name == (char *)0x0) {
      return (expression_base_value_f)0x0;
    }
    wVar2 = my_stricmp(name,pvVar3->name);
    pvVar1 = pvVar3 + 1;
  } while (wVar2 != L'\0');
  return pvVar3->function;
}

Assistant:

expression_base_value_f effect_value_base_by_name(const char *name)
{
	static const struct value_base_s {
		const char *name;
		expression_base_value_f function;
	} value_bases[] = {
		{ "SPELL_POWER", effect_value_base_spell_power },
		{ "PLAYER_LEVEL", effect_value_base_player_level },
		{ "DUNGEON_LEVEL", effect_value_base_dungeon_level },
		{ "MAX_SIGHT", effect_value_base_max_sight },
		{ "WEAPON_DAMAGE", effect_value_base_weapon_damage },
		{ "PLAYER_HP", effect_value_base_player_hp },
		{ "MONSTER_PERCENT_HP_GONE",
		  effect_value_base_monster_percent_hp_gone },
		{ "TRAP_POWER", effect_value_base_trap_power },
		{ NULL, NULL },
	};
	const struct value_base_s *current = value_bases;

	while (current->name != NULL && current->function != NULL) {
		if (my_stricmp(name, current->name) == 0)
			return current->function;

		current++;
	}

	return NULL;
}